

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringiterator_p.h
# Opt level: O0

char32_t __thiscall QStringIterator::next(QStringIterator *this,char32_t invalidAs)

{
  char16_t *pcVar1;
  bool bVar2;
  char16_t cVar3;
  char32_t in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  QChar uc;
  bool local_31;
  char32_t local_14;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = *(char16_t **)(in_RDI + 8);
  *(char16_t **)(in_RDI + 8) = pcVar1 + 1;
  local_a.ucs = *pcVar1;
  bVar2 = QChar::isSurrogate((QChar *)0x311096);
  if (bVar2) {
    bVar2 = QChar::isHighSurrogate((QChar *)0x3110ad);
    local_31 = false;
    if (bVar2) {
      bVar2 = hasNext((QStringIterator *)0x3110c6);
      local_31 = false;
      if (bVar2) {
        local_31 = QChar::isLowSurrogate((QChar *)0x3110e3);
      }
    }
    local_14 = in_ESI;
    if (local_31 != false) {
      *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 2;
      local_14 = QChar::surrogateToUcs4((QChar)0x0,(QChar)0x0);
    }
  }
  else {
    cVar3 = QChar::unicode(&local_a);
    local_14 = (char32_t)(ushort)cVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_14;
}

Assistant:

inline char32_t next(char32_t invalidAs = QChar::ReplacementCharacter)
    {
        Q_ASSERT_X(hasNext(), Q_FUNC_INFO, "iterator hasn't a next item");

        const QChar uc = *pos++;
        if (Q_UNLIKELY(uc.isSurrogate())) {
            if (Q_LIKELY(uc.isHighSurrogate() && hasNext() && pos->isLowSurrogate()))
                return QChar::surrogateToUcs4(uc, *pos++);
            return invalidAs;
        }

        return uc.unicode();
    }